

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall ktx::ValidationContext::fatal<>(ValidationContext *this,IssueFatal *issue)

{
  char *pcVar1;
  FatalValidationError *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  ValidationReport report;
  undefined1 local_d8 [8];
  _Alloc_hider local_d0;
  size_type local_c8;
  char local_c0 [16];
  string local_b0;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  char local_78 [16];
  _Alloc_hider local_68;
  char local_58 [16];
  undefined1 local_48 [24];
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_d8[0] = (issue->super_Issue).type;
  local_d8._2_2_ = (issue->super_Issue).id;
  pcVar1 = (issue->super_Issue).message._M_str;
  local_d0._M_p = local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,pcVar1,pcVar1 + (issue->super_Issue).message._M_len);
  fmt.size_ = 0;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_48;
  ::fmt::v10::vformat_abi_cxx11_(&local_b0,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args);
  if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*(this->callback)._M_invoker)((_Any_data *)&this->callback,(ValidationReport *)local_d8);
  this_00 = (FatalValidationError *)__cxa_allocate_exception(0x58);
  local_90._0_4_ = local_d8._0_4_;
  local_88._M_p = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_d0._M_p,local_d0._M_p + local_c8);
  local_68._M_p = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  FatalValidationError::FatalValidationError(this_00,(ValidationReport *)local_90);
  __cxa_throw(this_00,&FatalValidationError::typeinfo,FatalValidationError::~FatalValidationError);
}

Assistant:

void fatal(const IssueFatal& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        const auto report = ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)};
        callback(report);

        throw FatalValidationError(report);
    }